

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.cpp
# Opt level: O2

int __thiscall CaDiCaL::Internal::clause_contains_fixed_literal(Internal *this,Clause *c)

{
  int iVar1;
  int iVar2;
  Clause *__range1;
  int iVar3;
  int iVar4;
  long lVar5;
  
  iVar2 = c->size;
  iVar4 = 0;
  iVar3 = 0;
  for (lVar5 = 0; (long)iVar2 * 4 != lVar5; lVar5 = lVar5 + 4) {
    iVar1 = fixed(this,*(int *)((long)&c[1].field_0 + lVar5));
    iVar3 = iVar3 + (uint)(0 < iVar1);
    iVar4 = iVar4 - (iVar1 >> 0x1f);
  }
  iVar2 = 1;
  if (iVar3 == 0) {
    iVar2 = -(uint)(iVar4 != 0);
  }
  return iVar2;
}

Assistant:

int Internal::clause_contains_fixed_literal (Clause *c) {
  int satisfied = 0, falsified = 0;
  for (const auto &lit : *c) {
    const int tmp = fixed (lit);
    if (tmp > 0) {
      LOG (c, "root level satisfied literal %d in", lit);
      satisfied++;
    }
    if (tmp < 0) {
      LOG (c, "root level falsified literal %d in", lit);
      falsified++;
    }
  }
  if (satisfied)
    return 1;
  else if (falsified)
    return -1;
  else
    return 0;
}